

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.c
# Opt level: O3

MPI_Comm createCommGrid(int *rank,int *dims)

{
  int nproc;
  MPI_Comm Region;
  int periods [2];
  uint local_3c;
  MPI_Comm local_38;
  undefined8 local_30;
  
  local_30 = 0;
  dims[0] = 0;
  dims[1] = 0;
  MPI_Comm_size(&ompi_mpi_comm_world,&local_3c);
  MPI_Dims_create(local_3c,2,dims);
  MPI_Cart_create(&ompi_mpi_comm_world,2,dims,&local_30,1,&local_38);
  MPI_Comm_rank(local_38,rank);
  if (*rank == 0) {
    printf("size: %i, dims: [%ix%i]\n",(ulong)local_3c,(ulong)(uint)*dims,(ulong)(uint)dims[1]);
  }
  return local_38;
}

Assistant:

MPI_Comm createCommGrid (int *rank, int *dims)
{
	MPI_Comm Region;
	int  nproc, periods[2] = {0,0};
	dims[0] = dims[1] = 0;
	MPI_Comm_size(MPI_COMM_WORLD,&nproc);
	MPI_Dims_create(nproc,2,dims);
	MPI_Cart_create(MPI_COMM_WORLD,2,dims,periods,1,&Region);
	MPI_Comm_rank(Region,rank);
	if (*rank == 0)
		printf("size: %i, dims: [%ix%i]\n",nproc,dims[0],dims[1]);
	return Region;
}